

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evthread.c
# Opt level: O1

void evthread_enable_lock_debuging(void)

{
  if (evthread_lock_debugging_enabled_ != 0) {
    return;
  }
  original_lock_fns_.unlock = evthread_lock_fns_.unlock;
  original_lock_fns_.free = evthread_lock_fns_.free;
  original_lock_fns_.lock = evthread_lock_fns_.lock;
  original_lock_fns_._0_8_ = evthread_lock_fns_._0_8_;
  original_lock_fns_.alloc = evthread_lock_fns_.alloc;
  evthread_lock_fns_.lock_api_version = 1;
  evthread_lock_fns_.supported_locktypes = 1;
  evthread_lock_fns_.alloc = debug_lock_alloc;
  evthread_lock_fns_.free = debug_lock_free;
  evthread_lock_fns_.lock = debug_lock_lock;
  evthread_lock_fns_.unlock = debug_lock_unlock;
  original_cond_fns_._0_8_ = evthread_cond_fns_._0_8_;
  original_cond_fns_.alloc_condition = evthread_cond_fns_.alloc_condition;
  original_cond_fns_.free_condition = evthread_cond_fns_.free_condition;
  original_cond_fns_.signal_condition = evthread_cond_fns_.signal_condition;
  original_cond_fns_.wait_condition = evthread_cond_fns_.wait_condition;
  evthread_cond_fns_.wait_condition = debug_cond_wait;
  evthread_lock_debugging_enabled_ = 1;
  event_global_setup_locks_(0);
  return;
}

Assistant:

void
evthread_enable_lock_debugging(void)
{
	struct evthread_lock_callbacks cbs = {
		EVTHREAD_LOCK_API_VERSION,
		EVTHREAD_LOCKTYPE_RECURSIVE,
		debug_lock_alloc,
		debug_lock_free,
		debug_lock_lock,
		debug_lock_unlock
	};
	if (evthread_lock_debugging_enabled_)
		return;
	memcpy(&original_lock_fns_, &evthread_lock_fns_,
	    sizeof(struct evthread_lock_callbacks));
	memcpy(&evthread_lock_fns_, &cbs,
	    sizeof(struct evthread_lock_callbacks));

	memcpy(&original_cond_fns_, &evthread_cond_fns_,
	    sizeof(struct evthread_condition_callbacks));
	evthread_cond_fns_.wait_condition = debug_cond_wait;
	evthread_lock_debugging_enabled_ = 1;

	/* XXX return value should get checked. */
	event_global_setup_locks_(0);
}